

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VScaleAddMulti(N_Vector X,sunindextype local_length,int myid)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint in_EDX;
  N_Vector in_RDI;
  double dVar5;
  double dVar6;
  N_Vector *Z;
  N_Vector *V;
  sunrealtype avals [3];
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  undefined8 local_58;
  sunindextype sVar7;
  N_Vector p_Var8;
  sunrealtype in_stack_ffffffffffffffc0;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  puVar3 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  local_58 = 0;
  sVar7 = 0;
  p_Var8 = (N_Vector)0x0;
  N_VConst(0x3ff0000000000000,in_RDI);
  N_VConst(0xbff0000000000000,*puVar4);
  local_58 = 0x4000000000000000;
  dVar5 = get_time();
  iVar1 = N_VScaleAddMulti(1,&local_58,in_RDI,puVar4,puVar4);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMulti Case 1a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1a, Proc %d \n",(ulong)in_EDX);
    local_18 = 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VScaleAddMulti");
  }
  N_VConst(0x3ff0000000000000,in_RDI);
  N_VConst(0xbff0000000000000,*puVar4);
  local_58 = 0x4000000000000000;
  N_VConst(0,*puVar3);
  dVar5 = get_time();
  iVar1 = N_VScaleAddMulti(1,&local_58,in_RDI,puVar4,puVar3);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    local_1c = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMulti Case 1b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VScaleAddMulti");
  }
  N_VConst(0x3ff0000000000000,in_RDI);
  N_VConst(0xc000000000000000,*puVar4);
  N_VConst(0x4000000000000000,puVar4[1]);
  N_VConst(0xbff0000000000000,puVar4[2]);
  local_58 = 0x3ff0000000000000;
  sVar7 = -0x4000000000000000;
  p_Var8 = (N_Vector)&DAT_4000000000000000;
  dVar5 = get_time();
  iVar1 = N_VScaleAddMulti(3,&local_58,in_RDI,puVar4,puVar4);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
    iVar2 = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
    local_1c = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMulti Case 2a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2a, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VScaleAddMulti");
  }
  N_VConst(0x3ff0000000000000,in_RDI);
  N_VConst(0xc000000000000000,*puVar4);
  N_VConst(0x4000000000000000,puVar4[1]);
  N_VConst(0xbff0000000000000,puVar4[2]);
  local_58 = 0x3ff0000000000000;
  sVar7 = -0x4000000000000000;
  p_Var8 = (N_Vector)&DAT_4000000000000000;
  N_VConst(0x4000000000000000,*puVar3);
  N_VConst(0x4000000000000000,puVar3[1]);
  N_VConst(0x4000000000000000,puVar3[2]);
  dVar5 = get_time();
  iVar1 = N_VScaleAddMulti(3,&local_58,in_RDI,puVar4,puVar3);
  sync_device(in_RDI);
  dVar6 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
    iVar2 = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
    local_1c = check_ans(in_stack_ffffffffffffffc0,p_Var8,sVar7);
    local_1c = local_1c + iVar2 + iVar1;
  }
  else {
    local_1c = 1;
  }
  if (local_1c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleAddMulti Case 2b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2b, Proc %d \n",(ulong)in_EDX);
    local_18 = local_18 + 1;
  }
  dVar5 = max_time(in_RDI,dVar6 - dVar5);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar5,"N_VScaleAddMulti");
  }
  N_VDestroyVectorArray(puVar3,3);
  N_VDestroyVectorArray(puVar4,3);
  return local_18;
}

Assistant:

int Test_N_VScaleAddMulti(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype avals[3];
  N_Vector *V, *Z;

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, X);
  V = N_VCloneVectorArray(3, X);

  /* initialize a values */
  avals[0] = ZERO;
  avals[1] = ZERO;
  avals[2] = ZERO;

  /*
   * Case 1a: V[0] = a[0] x + V[0], N_VLinearSum
   */

  /* fill vector data */
  N_VConst(ONE, X);
  N_VConst(NEG_ONE, V[0]);

  /* set scaling factors */
  avals[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleAddMulti(1, avals, X, V, V);
  sync_device(X);
  stop_time = get_time();

  /* V[0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, V[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 1a \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 1b: Z[0] = a[0] x + V[0], N_VLinearSum
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X);
  N_VConst(NEG_ONE, V[0]);

  avals[0] = TWO;

  N_VConst(ZERO, Z[0]);

  start_time = get_time();
  ierr       = N_VScaleAddMulti(1, avals, X, V, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[0] should be vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 1b \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 2a: V[i] = a[i] x + V[i], N_VScaleAddMulti
   */

  /* fill vector data */
  N_VConst(ONE, X);
  N_VConst(NEG_TWO, V[0]);
  N_VConst(TWO, V[1]);
  N_VConst(NEG_ONE, V[2]);

  /* set scaling factors */
  avals[0] = ONE;
  avals[1] = NEG_TWO;
  avals[2] = TWO;

  start_time = get_time();
  ierr       = N_VScaleAddMulti(3, avals, X, V, V);
  sync_device(X);
  stop_time = get_time();

  /* V[i] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, V[0], local_length);
    failure += check_ans(ZERO, V[1], local_length);
    failure += check_ans(ONE, V[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 2a \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /*
   * Case 2b: Z[i] = a[i] x + V[i], N_VScaleAddMulti
   */

  /* fill vector data and set scaling factors */
  N_VConst(ONE, X);
  N_VConst(NEG_TWO, V[0]);
  N_VConst(TWO, V[1]);
  N_VConst(NEG_ONE, V[2]);

  avals[0] = ONE;
  avals[1] = NEG_TWO;
  avals[2] = TWO;

  N_VConst(TWO, Z[0]);
  N_VConst(TWO, Z[1]);
  N_VConst(TWO, Z[2]);

  start_time = get_time();
  ierr       = N_VScaleAddMulti(3, avals, X, V, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[i] should be a vector of -1, 0, +1 */
  if (ierr == 0)
  {
    failure = check_ans(NEG_ONE, Z[0], local_length);
    failure += check_ans(ZERO, Z[1], local_length);
    failure += check_ans(ONE, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleAddMulti Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScaleAddMulti Case 2b \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMulti", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(V, 3);

  return (fails);
}